

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexTextureTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::Vertex3DTextureCase::Vertex3DTextureCase
          (Vertex3DTextureCase *this,Context *testCtx,char *name,char *desc,deUint32 minFilter,
          deUint32 magFilter,deUint32 wrapS,deUint32 wrapT,deUint32 wrapR)

{
  tcu::TestCase::TestCase((TestCase *)this,testCtx->m_testCtx,NODETYPE_SELF_VALIDATE,name,desc);
  (this->super_TestCase).m_context = testCtx;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__Vertex3DTextureCase_00d27f28;
  this->m_minFilter = minFilter;
  this->m_magFilter = magFilter;
  this->m_wrapS = wrapS;
  this->m_wrapT = wrapT;
  this->m_wrapR = wrapR;
  this->m_program = (ShaderProgram *)0x0;
  this->m_textures[0] = (Texture3D *)0x0;
  this->m_textures[1] = (Texture3D *)0x0;
  return;
}

Assistant:

Vertex3DTextureCase::Vertex3DTextureCase (Context& testCtx, const char* name, const char* desc, deUint32 minFilter, deUint32 magFilter, deUint32 wrapS, deUint32 wrapT, deUint32 wrapR)
	: TestCase				(testCtx, tcu::NODETYPE_SELF_VALIDATE, name, desc)
	, m_minFilter			(minFilter)
	, m_magFilter			(magFilter)
	, m_wrapS				(wrapS)
	, m_wrapT				(wrapT)
	, m_wrapR				(wrapR)
	, m_program				(DE_NULL)
{
	m_textures[0] = DE_NULL;
	m_textures[1] = DE_NULL;
}